

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O3

spv_result_t spvtools::anon_unknown_6::advance(spv_text text,spv_position position)

{
  size_t *psVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  spv_position psVar7;
  
  uVar4 = text->length;
  uVar6 = position->index;
  if (uVar6 < uVar4) {
    pcVar5 = text->str;
    psVar1 = &position->column;
    do {
      bVar2 = pcVar5[uVar6];
      psVar7 = (spv_position)psVar1;
      if (bVar2 < 0xd) {
        if (bVar2 != 9) {
          if (bVar2 != 10) {
            if (bVar2 == 0) {
              return SPV_END_OF_STREAM;
            }
            return SPV_SUCCESS;
          }
          goto LAB_005e95a9;
        }
      }
      else if ((bVar2 != 0xd) && (bVar2 != 0x20)) {
        if (bVar2 != 0x3b) {
          return SPV_SUCCESS;
        }
        while( true ) {
          cVar3 = pcVar5[uVar6];
          if (cVar3 == '\0') {
            return SPV_END_OF_STREAM;
          }
          if (cVar3 == '\n') break;
          position->column = position->column + 1;
          uVar6 = uVar6 + 1;
          position->index = uVar6;
          if (uVar4 == uVar6) {
            return SPV_END_OF_STREAM;
          }
        }
LAB_005e95a9:
        *psVar1 = 0;
        psVar7 = position;
      }
      psVar7->line = psVar7->line + 1;
      uVar6 = uVar6 + 1;
      position->index = uVar6;
    } while (uVar6 < uVar4);
  }
  return SPV_END_OF_STREAM;
}

Assistant:

spv_result_t advance(spv_text text, spv_position position) {
  // NOTE: Consume white space, otherwise don't advance.
  while (true) {
    if (position->index >= text->length) return SPV_END_OF_STREAM;
    switch (text->str[position->index]) {
      case '\0':
        return SPV_END_OF_STREAM;
      case ';':
        if (spv_result_t error = advanceLine(text, position)) return error;
        continue;
      case ' ':
      case '\t':
      case '\r':
        position->column++;
        position->index++;
        continue;
      case '\n':
        position->column = 0;
        position->line++;
        position->index++;
        continue;
      default:
        return SPV_SUCCESS;
    }
  }
}